

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O0

void yv12_copy_plane(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int plane)

{
  int in_EDX;
  YV12_BUFFER_CONFIG *in_stack_00000018;
  YV12_BUFFER_CONFIG *in_stack_00000020;
  
  if (in_EDX == 0) {
    aom_yv12_copy_y_c(in_stack_00000020,in_stack_00000018,src_bc._4_4_);
  }
  else if (in_EDX == 1) {
    aom_yv12_copy_u_c(in_stack_00000020,in_stack_00000018,src_bc._4_4_);
  }
  else if (in_EDX == 2) {
    aom_yv12_copy_v_c(in_stack_00000020,in_stack_00000018,src_bc._4_4_);
  }
  return;
}

Assistant:

static void yv12_copy_plane(const YV12_BUFFER_CONFIG *src_bc,
                            YV12_BUFFER_CONFIG *dst_bc, int plane) {
  switch (plane) {
    case 0: aom_yv12_copy_y(src_bc, dst_bc, 0); break;
    case 1: aom_yv12_copy_u(src_bc, dst_bc, 0); break;
    case 2: aom_yv12_copy_v(src_bc, dst_bc, 0); break;
    default: assert(plane >= 0 && plane <= 2); break;
  }
}